

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O2

DdNode * Dsd_TreeGetPrimeFunction(DdManager *dd,Dsd_Node_t *pNode)

{
  int iVar1;
  int *piVar2;
  Dsd_Node_t *pDVar3;
  Dsd_Node_t *pDVar4;
  int *permut;
  int *pVar2Form;
  int *pForm2Var;
  DdNode **pbCube0;
  DdNode **pbCube1;
  DdNode *pDVar5;
  DdNode *pDVar6;
  st__table *pCache;
  DdNode *pDVar7;
  long lVar8;
  Dsd_Node_t *pDVar9;
  size_t sVar10;
  long lVar11;
  
  iVar1 = dd->size;
  sVar10 = (long)iVar1 * 4;
  permut = (int *)malloc(sVar10);
  pVar2Form = (int *)malloc(sVar10);
  pForm2Var = (int *)malloc(sVar10);
  sVar10 = (long)iVar1 << 3;
  pbCube0 = (DdNode **)malloc(sVar10);
  pbCube1 = (DdNode **)malloc(sVar10);
  lVar11 = 0;
  for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
    piVar2 = dd->invperm;
    pForm2Var[lVar8] = piVar2[lVar8];
    pDVar3 = pNode->pDecs[lVar8];
    pDVar4 = (Dsd_Node_t *)dd->one;
    lVar11 = (long)(int)lVar11;
    pDVar9 = pDVar3;
    while (pDVar9 = (Dsd_Node_t *)pDVar9->S, pDVar9 != pDVar4) {
      iVar1 = piVar2[lVar11];
      permut[pDVar9->Type] = iVar1;
      pVar2Form[iVar1] = (int)lVar8;
      lVar11 = lVar11 + 1;
    }
    pDVar5 = Extra_bddGetOneCube(dd,(DdNode *)((ulong)pDVar3->G ^ 1));
    pbCube0[lVar8] = pDVar5;
    Cudd_Ref(pDVar5);
    pDVar5 = Extra_bddGetOneCube(dd,pNode->pDecs[lVar8]->G);
    pbCube1[lVar8] = pDVar5;
    Cudd_Ref(pDVar5);
  }
  pDVar5 = Cudd_bddPermute(dd,pNode->G,permut);
  Cudd_Ref(pDVar5);
  for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
    pDVar7 = pbCube0[lVar8];
    pDVar6 = Cudd_bddPermute(dd,pDVar7,permut);
    pbCube0[lVar8] = pDVar6;
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDeref(dd,pDVar7);
    pDVar7 = pbCube1[lVar8];
    pDVar6 = Cudd_bddPermute(dd,pDVar7,permut);
    pbCube1[lVar8] = pDVar6;
    Cudd_Ref(pDVar6);
    Cudd_RecursiveDeref(dd,pDVar7);
  }
  pCache = st__init_table(st__ptrcmp,st__ptrhash);
  pDVar7 = Extra_dsdRemap(dd,pDVar5,pCache,pVar2Form,pForm2Var,pbCube0,pbCube1);
  Cudd_Ref(pDVar7);
  st__free_table(pCache);
  Cudd_RecursiveDeref(dd,pDVar5);
  for (lVar8 = 0; lVar8 < pNode->nDecs; lVar8 = lVar8 + 1) {
    Cudd_RecursiveDeref(dd,pbCube0[lVar8]);
    Cudd_RecursiveDeref(dd,pbCube1[lVar8]);
  }
  free(permut);
  free(pVar2Form);
  free(pForm2Var);
  free(pbCube0);
  free(pbCube1);
  Cudd_Deref(pDVar7);
  return pDVar7;
}

Assistant:

DdNode * Dsd_TreeGetPrimeFunction( DdManager * dd, Dsd_Node_t * pNode ) 
{
    int * pForm2Var;   // the mapping of each formal input into its first var
    int * pVar2Form;   // the mapping of each var into its formal inputs
    int i, iVar, iLev, * pPermute;
    DdNode ** pbCube0, ** pbCube1;
    DdNode * bFunc, * bRes, * bTemp;
    st__table * pCache;
    
    pPermute  = ABC_ALLOC( int, dd->size );
    pVar2Form = ABC_ALLOC( int, dd->size );
    pForm2Var = ABC_ALLOC( int, dd->size );

    pbCube0 = ABC_ALLOC( DdNode *, dd->size );
    pbCube1 = ABC_ALLOC( DdNode *, dd->size );

    // remap the global function in such a way that
    // the support variables of each formal input are adjacent
    iLev = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pForm2Var[i] = dd->invperm[i];
        for ( bTemp = pNode->pDecs[i]->S; bTemp != b1; bTemp = cuddT(bTemp) )
        {
            iVar = dd->invperm[iLev];
            pPermute[bTemp->index] = iVar;
            pVar2Form[iVar] = i;
            iLev++;
        }

        // collect the cubes representing each assignment
        pbCube0[i] = Extra_bddGetOneCube( dd, Cudd_Not(pNode->pDecs[i]->G) );
        Cudd_Ref( pbCube0[i] );
        pbCube1[i] = Extra_bddGetOneCube( dd, pNode->pDecs[i]->G );
        Cudd_Ref( pbCube1[i] );
    }

    // remap the function
    bFunc = Cudd_bddPermute( dd, pNode->G, pPermute ); Cudd_Ref( bFunc );
    // remap the cube
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        pbCube0[i] = Cudd_bddPermute( dd, bTemp = pbCube0[i], pPermute ); Cudd_Ref( pbCube0[i] );
        Cudd_RecursiveDeref( dd, bTemp );
        pbCube1[i] = Cudd_bddPermute( dd, bTemp = pbCube1[i], pPermute ); Cudd_Ref( pbCube1[i] );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    // remap the function
    pCache = st__init_table( st__ptrcmp, st__ptrhash);;
    bRes = Extra_dsdRemap( dd, bFunc, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 );  Cudd_Ref( bRes );
    st__free_table( pCache );

    Cudd_RecursiveDeref( dd, bFunc );
    for ( i = 0; i < pNode->nDecs; i++ )
    {
        Cudd_RecursiveDeref( dd, pbCube0[i] );
        Cudd_RecursiveDeref( dd, pbCube1[i] );
    }
/*
////////////
    // permute the function once again
    // in such a way that i-th var stood for i-th formal input
    for ( i = 0; i < dd->size; i++ )
        pPermute[i] = -1;
    for ( i = 0; i < pNode->nDecs; i++ )
        pPermute[dd->invperm[i]] = i;
    bRes = Cudd_bddPermute( dd, bTemp = bRes, pPermute ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bTemp );
////////////
*/
    ABC_FREE(pPermute);
    ABC_FREE(pVar2Form);
    ABC_FREE(pForm2Var);
    ABC_FREE(pbCube0);
    ABC_FREE(pbCube1);

    Cudd_Deref( bRes );
    return bRes;
}